

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void emulator_set_builtin_palette(Emulator *e,u32 index)

{
  PaletteRGBA *pPVar1;
  int local_24;
  int i;
  size_t count;
  u32 index_local;
  Emulator *e_local;
  
  if (index < 0x54) {
    emulator_set_bw_palette(e,PALETTE_TYPE_BGP,emulator_set_builtin_palette::pals[index]);
    emulator_set_bw_palette(e,PALETTE_TYPE_OBP0,emulator_set_builtin_palette::pals[index] + 1);
    emulator_set_bw_palette(e,PALETTE_TYPE_OBP1,emulator_set_builtin_palette::pals[index] + 2);
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      pPVar1 = (e->state).sgb.screen_pal + local_24;
      *(undefined8 *)pPVar1->color =
           *(undefined8 *)emulator_set_builtin_palette::pals[index][0].color;
      *(undefined8 *)(pPVar1->color + 2) =
           *(undefined8 *)(emulator_set_builtin_palette::pals[index][0].color + 2);
    }
    update_bw_palette_rgba(e,PALETTE_TYPE_BGP);
  }
  return;
}

Assistant:

void emulator_set_builtin_palette(Emulator* e, u32 index) {
  static const PaletteRGBA pals[][3] = {
#define PAL(b0, b1, b2, b3, o00, o01, o02, o03, o10, o11, o12, o13) \
  {{{b0, b1, b2, b3}}, {{o00, o01, o02, o03}}, {{o10, o11, o12, o13}}},
#define PAL3(c0, c1, c2, c3) \
  {{{c0, c1, c2, c3}}, {{c0, c1, c2, c3}}, {{c0, c1, c2, c3}}},
#include "builtin-palettes.def"
#undef PAL
#undef PAL3
  };
  size_t count = sizeof(pals) / sizeof(*pals);
  if (index >= count) { return; }
  emulator_set_bw_palette(e, 0, &pals[index][0]);
  emulator_set_bw_palette(e, 1, &pals[index][1]);
  emulator_set_bw_palette(e, 2, &pals[index][2]);
  for (int i = 0; i < 4; ++i) {
    SGB.screen_pal[i] = pals[index][0];
  }
  update_bw_palette_rgba(e, PALETTE_TYPE_BGP);
}